

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  char cVar1;
  char *value;
  size_t size;
  ArrayPtr<const_char> AVar2;
  Array<char> local_b8;
  char local_99;
  Fault local_98;
  Fault f;
  char local_79 [8];
  anon_class_1_0_00000001 local_71;
  undefined1 local_70 [8];
  ArrayPtr<const_char> stringValue;
  undefined1 local_50 [8];
  Vector<char> decoded;
  undefined1 local_28 [8];
  ArrayPtr<const_char> initalString;
  Parser *this_local;
  
  initalString.size_ = (size_t)this;
  Input::consume(&this->input,'\"');
  _local_28 = (anonymous_namespace)::Input::
              consumeWhile<capnp::(anonymous_namespace)::Parser::consumeQuotedString()::_lambda(char)_1_>
                        ((Input *)&this->input,
                         (anon_class_1_0_00000001 *)((long)&decoded.builder.disposer + 7));
  cVar1 = Input::nextChar(&this->input);
  if (cVar1 == '\"') {
    Input::advance(&this->input,1);
    value = kj::ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)local_28);
    size = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
    kj::heapString(__return_storage_ptr__,value,size);
  }
  else {
    kj::Vector<char>::Vector((Vector<char> *)local_50);
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>
              ((Vector<char> *)local_50,(ArrayPtr<const_char> *)local_28);
    do {
      AVar2 = (anonymous_namespace)::Input::
              consumeWhile<capnp::(anonymous_namespace)::Parser::consumeQuotedString()::_lambda(char)_2_>
                        ((Input *)&this->input,&local_71);
      stringValue.ptr = (char *)AVar2.size_;
      local_70 = (undefined1  [8])AVar2.ptr;
      kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>
                ((Vector<char> *)local_50,(ArrayPtr<const_char> *)local_70);
      cVar1 = Input::nextChar(&this->input);
      if (cVar1 == '\\') {
        Input::advance(&this->input,1);
        cVar1 = Input::nextChar(&this->input);
        switch(cVar1) {
        case '\"':
          local_79[7] = 0x22;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 7);
          Input::advance(&this->input,1);
          break;
        default:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    (&local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x31e,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                     (char (*) [31])"Invalid escape in JSON string.");
          kj::_::Debug::Fault::fatal(&local_98);
        case '/':
          local_79[5] = 0x2f;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 5);
          Input::advance(&this->input,1);
          break;
        case '\\':
          local_79[6] = 0x5c;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 6);
          Input::advance(&this->input,1);
          break;
        case 'b':
          local_79[4] = 8;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 4);
          Input::advance(&this->input,1);
          break;
        case 'f':
          local_79[3] = 0xc;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 3);
          Input::advance(&this->input,1);
          break;
        case 'n':
          local_79[2] = 10;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 2);
          Input::advance(&this->input,1);
          break;
        case 'r':
          local_79[1] = 0xd;
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79 + 1);
          Input::advance(&this->input,1);
          break;
        case 't':
          local_79[0] = '\t';
          kj::Vector<char>::add<char>((Vector<char> *)local_50,local_79);
          Input::advance(&this->input,1);
          break;
        case 'u':
          Input::consume(&this->input,'u');
          AVar2 = Input::consume(&this->input,4);
          f.exception = (Exception *)AVar2.ptr;
          unescapeAndAppend(this,AVar2,(Vector<char> *)local_50);
        }
      }
      cVar1 = Input::nextChar(&this->input);
    } while (cVar1 != '\"');
    Input::consume(&this->input,'\"');
    local_99 = '\0';
    kj::Vector<char>::add<char>((Vector<char> *)local_50,&local_99);
    kj::Vector<char>::releaseAsArray(&local_b8,(Vector<char> *)local_50);
    kj::String::String(__return_storage_ptr__,&local_b8);
    kj::Array<char>::~Array(&local_b8);
    kj::Vector<char>::~Vector((Vector<char> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Get statistics on string size and preallocate?

    auto initalString = input.consumeWhile([](const char chr) {
        return chr != '"' && chr != '\\';
    });
    if (input.nextChar() == '"') {
      // optimization: Avoid allocating vector if no escapes encountered.
      input.advance();
      return kj::heapString(initalString.begin(), initalString.size());
    }

    kj::Vector<char> decoded;
    decoded.addAll(initalString);

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }